

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O0

CURLcode tftp_perform(Curl_easy *data,_Bool *dophase_done)

{
  tftp_state_data *state_00;
  CURLcode CVar1;
  tftp_state_data *state;
  connectdata *conn;
  CURLcode result;
  _Bool *dophase_done_local;
  Curl_easy *data_local;
  
  state_00 = (data->conn->proto).tftpc;
  *dophase_done = false;
  CVar1 = tftp_state_machine(state_00,TFTP_EVENT_INIT);
  if ((state_00->state != TFTP_STATE_FIN) && (CVar1 == CURLE_OK)) {
    tftp_multi_statemach(data,dophase_done);
  }
  return CVar1;
}

Assistant:

static CURLcode tftp_perform(struct Curl_easy *data, bool *dophase_done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct tftp_state_data *state = conn->proto.tftpc;

  *dophase_done = FALSE;

  result = tftp_state_machine(state, TFTP_EVENT_INIT);

  if((state->state == TFTP_STATE_FIN) || result)
    return result;

  tftp_multi_statemach(data, dophase_done);

  if(*dophase_done)
    DEBUGF(infof(data, "DO phase is complete"));

  return result;
}